

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool spirv_cross::CompilerGLSL::needs_enclose_expression(string *expr)

{
  byte bVar1;
  size_type sVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  
  sVar2 = expr->_M_string_length;
  if (sVar2 != 0) {
    bVar1 = *(expr->_M_dataplus)._M_p;
    if ((((ulong)bVar1 < 0x2e) && ((0x2c4200000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       (bVar1 == 0x7e)) {
      bVar3 = true;
      goto LAB_0013761f;
    }
  }
  bVar3 = false;
LAB_0013761f:
  if (!bVar3) {
    if (sVar2 == 0) {
      bVar6 = true;
    }
    else {
      iVar5 = 0;
      lVar4 = 0;
      do {
        bVar1 = (expr->_M_dataplus)._M_p[lVar4];
        if (bVar1 < 0x5b) {
          if (bVar1 == 0x28) {
LAB_0013765e:
            iVar5 = iVar5 + 1;
            goto LAB_00137686;
          }
          if (bVar1 == 0x29) goto LAB_00137662;
LAB_0013766a:
          if (bVar1 != 0x20 || iVar5 != 0) goto LAB_00137686;
          bVar6 = true;
          iVar5 = 0;
          bVar3 = true;
        }
        else {
          if (bVar1 != 0x5d) {
            if (bVar1 != 0x5b) goto LAB_0013766a;
            goto LAB_0013765e;
          }
LAB_00137662:
          if (iVar5 == 0) {
            __assert_fail("paren_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                          ,0x1401,
                          "static bool spirv_cross::CompilerGLSL::needs_enclose_expression(const std::string &)"
                         );
          }
          iVar5 = iVar5 + -1;
LAB_00137686:
          bVar6 = false;
        }
      } while ((!bVar6) && (bVar6 = sVar2 - 1 != lVar4, lVar4 = lVar4 + 1, bVar6));
      bVar6 = iVar5 == 0;
    }
    if (!bVar6) {
      __assert_fail("paren_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x140a,
                    "static bool spirv_cross::CompilerGLSL::needs_enclose_expression(const std::string &)"
                   );
    }
  }
  return bVar3;
}

Assistant:

bool CompilerGLSL::needs_enclose_expression(const std::string &expr)
{
	bool need_parens = false;

	// If the expression starts with a unary we need to enclose to deal with cases where we have back-to-back
	// unary expressions.
	if (!expr.empty())
	{
		auto c = expr.front();
		if (c == '-' || c == '+' || c == '!' || c == '~' || c == '&' || c == '*')
			need_parens = true;
	}

	if (!need_parens)
	{
		uint32_t paren_count = 0;
		for (auto c : expr)
		{
			if (c == '(' || c == '[')
				paren_count++;
			else if (c == ')' || c == ']')
			{
				assert(paren_count);
				paren_count--;
			}
			else if (c == ' ' && paren_count == 0)
			{
				need_parens = true;
				break;
			}
		}
		assert(paren_count == 0);
	}

	return need_parens;
}